

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O2

Qiniu_Error
Qiniu_RS_BatchDeleteAfterDays
          (Qiniu_Client *self,Qiniu_RS_BatchItemRet *rets,Qiniu_RS_EntryDeleteAfterDays *entries,
          Qiniu_ItemCount entryCount)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char *s1;
  char *__s;
  char *s2;
  char *s3;
  size_t bodyLen;
  cJSON *pcVar5;
  Qiniu_Int64 QVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  char *__s_00;
  int *piVar10;
  Qiniu_Error QVar11;
  Qiniu_Error QVar12;
  char *rsHost;
  cJSON *root;
  char *local_40;
  cJSON *local_38;
  
  QVar11 = _Qiniu_Region_Get_Rs_Host(self,(char *)0x0,entries->bucket,&local_40);
  if (QVar11.code == 200) {
    pcVar3 = Qiniu_String_Concat2(local_40,"/batch");
    uVar7 = (ulong)(uint)entryCount;
    if (entryCount < 1) {
      uVar7 = 0;
    }
    __s_00 = (char *)0x0;
    for (lVar8 = 0; uVar7 * 0x18 != lVar8; lVar8 = lVar8 + 0x18) {
      pcVar4 = Qiniu_String_Concat3
                         (*(char **)((long)&entries->bucket + lVar8),":",
                          *(char **)((long)&entries->key + lVar8));
      s1 = Qiniu_String_Encode(pcVar4);
      iVar1 = snprintf((char *)0x0,0,"%d",(ulong)*(uint *)((long)&entries->days + lVar8));
      __s = (char *)malloc((long)(iVar1 + 1));
      snprintf(__s,(long)(iVar1 + 1),"%d",(ulong)*(uint *)((long)&entries->days + lVar8));
      s2 = Qiniu_String_Concat(s1,"/",__s,0);
      s3 = Qiniu_String_Concat2("op=/deleteAfterDays/",s2);
      Qiniu_Free(pcVar4);
      Qiniu_Free(s1);
      Qiniu_Free(__s);
      Qiniu_Free(s2);
      pcVar4 = s3;
      if (__s_00 != (char *)0x0) {
        pcVar4 = Qiniu_String_Concat3(__s_00,"&",s3);
        free(s3);
      }
      free(__s_00);
      __s_00 = pcVar4;
    }
    bodyLen = strlen(__s_00);
    QVar12 = Qiniu_Client_CallWithBuffer
                       (self,&local_38,pcVar3,__s_00,bodyLen,"application/x-www-form-urlencoded");
    free(pcVar3);
    free(__s_00);
    uVar2 = cJSON_GetArraySize(local_38);
    uVar9 = 0;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = uVar9;
    }
    piVar10 = &rets->code;
    for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      pcVar5 = cJSON_GetArrayItem(local_38,(int)uVar9);
      QVar6 = Qiniu_Json_GetInt64(pcVar5,"code",0);
      pcVar5 = cJSON_GetObjectItem(pcVar5,"data");
      *piVar10 = (int)QVar6;
      if ((int)QVar6 != 200) {
        pcVar3 = Qiniu_Json_GetString(pcVar5,"error",(char *)0x0);
        ((Qiniu_RS_BatchItemRet *)(piVar10 + -2))->error = pcVar3;
      }
      piVar10 = piVar10 + 4;
    }
    QVar11._4_4_ = 0;
    QVar11.code = QVar12.code;
    QVar11.message = QVar12.message;
  }
  return QVar11;
}

Assistant:

Qiniu_Error Qiniu_RS_BatchDeleteAfterDays(Qiniu_Client *self, Qiniu_RS_BatchItemRet *rets,
                                          Qiniu_RS_EntryDeleteAfterDays *entries, Qiniu_ItemCount entryCount)
{
    int code;
    Qiniu_Error err;
    cJSON *root, *arrayItem, *dataItem;
    char *body = NULL, *bodyTmp = NULL;
    char *entryURI, *entryURIEncoded, *daysStr, *opBody, *bodyPart;

    Qiniu_ItemCount curr = 0;
    Qiniu_ItemCount retSize = 0;
    Qiniu_RS_EntryDeleteAfterDays *entry = entries;
    const char *rsHost;

    err = _Qiniu_Region_Get_Rs_Host(self, NULL, entry->bucket, &rsHost);
    if (err.code != 200)
    {
        return err;
    }

    char *url = Qiniu_String_Concat2(rsHost, "/batch");

    curr = 0;
    while (curr < entryCount)
    {
        entryURI = Qiniu_String_Concat3(entry->bucket, ":", entry->key);
        entryURIEncoded = Qiniu_String_Encode(entryURI);

        size_t daysLen = snprintf(NULL, 0, "%d", entry->days) + 1;
        daysStr = (char *)malloc(sizeof(char) * daysLen);
        snprintf(daysStr, daysLen, "%d", entry->days);

        bodyPart = Qiniu_String_Concat(entryURIEncoded, "/", daysStr, NULL);
        opBody = Qiniu_String_Concat2("op=/deleteAfterDays/", bodyPart);
        Qiniu_Free(entryURI);
        Qiniu_Free(entryURIEncoded);
        Qiniu_Free(daysStr);
        Qiniu_Free(bodyPart);

        if (!body)
        {
            bodyTmp = opBody;
        }
        else
        {
            bodyTmp = Qiniu_String_Concat3(body, "&", opBody);
            free(opBody);
        }
        free(body);
        body = bodyTmp;
        curr++;
        entry = &entries[curr];
    }

    err = Qiniu_Client_CallWithBuffer(self, &root,
                                      url, body, strlen(body), "application/x-www-form-urlencoded");
    free(url);
    free(body);

    retSize = cJSON_GetArraySize(root);

    curr = 0;
    while (curr < retSize)
    {
        arrayItem = cJSON_GetArrayItem(root, curr);
        code = (int)Qiniu_Json_GetInt64(arrayItem, "code", 0);
        dataItem = cJSON_GetObjectItem(arrayItem, "data");

        rets[curr].code = code;

        if (code != 200)
        {
            rets[curr].error = Qiniu_Json_GetString(dataItem, "error", 0);
        }
        curr++;
    }

    return err;
}